

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::analysis::TensorViewNV::IsSameImpl
          (TensorViewNV *this,Type *that,IsSameCache *param_2)

{
  pointer __s1;
  pointer puVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t __n;
  long lVar3;
  
  iVar2 = (*that->_vptr_Type[0x44])(that);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (((lVar3 != 0) && (*(int *)&(this->super_Type).field_0x24 == *(int *)(lVar3 + 0x24))) &&
     (this->has_dimensions_id_ == *(uint32_t *)(lVar3 + 0x28))) {
    __s1 = (this->perm_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
    puVar1 = (this->perm_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    __n = (long)puVar1 - (long)__s1;
    if (__n == *(long *)(lVar3 + 0x38) - (long)*(void **)(lVar3 + 0x30)) {
      if (puVar1 != __s1) {
        iVar2 = bcmp(__s1,*(void **)(lVar3 + 0x30),__n);
        return iVar2 == 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool TensorViewNV::IsSameImpl(const Type* that, IsSameCache*) const {
  const TensorViewNV* tv = that->AsTensorViewNV();
  if (!tv) return false;
  return dim_id_ == tv->dim_id_ &&
         has_dimensions_id_ == tv->has_dimensions_id_ && perm_ == tv->perm_;
}